

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::enumAlgNames
                (AlgorithmicRange *range,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  byte bVar1;
  UBool UVar2;
  uint16_t uVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  ushort uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  uint16_t indexes [8];
  char *elements [8];
  char buffer [200];
  char *elementBases [8];
  
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) != U_UNICODE_CHAR_NAME) {
    return '\x01';
  }
  if (range->type == '\x01') {
    bVar1 = range->variant;
    uVar10 = (ulong)bVar1;
    for (uVar12 = 0; cVar6 = *(char *)((long)&range[1].start + uVar12 + uVar10 * 2), cVar6 != '\0';
        uVar12 = uVar12 + 1) {
      buffer[uVar12] = cVar6;
    }
    uVar3 = writeFactorSuffix((uint16_t *)(range + 1),(ushort)bVar1,
                              (char *)((long)&range[1].start + uVar12 + uVar10 * 2 + 1),
                              start - range->start,indexes,elementBases,elements,buffer + uVar12,
                              200 - (short)uVar12);
    cVar6 = (*fn)(context,start,nameChoice,buffer,(int)uVar12 + (uint)uVar3 & 0xffff);
    while( true ) {
      if (cVar6 == '\0') {
        return '\0';
      }
      start = start + 1;
      uVar4 = (uint)(ushort)bVar1;
      if (limit <= start) break;
      while( true ) {
        uVar4 = uVar4 - 1 & 0xffff;
        uVar7 = *(short *)((long)indexes + (ulong)(uVar4 * 2)) + 1;
        if (uVar7 < *(ushort *)((long)&range[1].start + (ulong)(uVar4 * 2))) break;
        indexes[uVar4] = 0;
        *(undefined8 *)((long)elements + (ulong)(uVar4 * 8)) =
             *(undefined8 *)((long)elementBases + (ulong)(uVar4 * 8));
      }
      indexes[uVar4] = uVar7;
      pcVar9 = elements[uVar4];
      do {
        cVar6 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar6 != '\0');
      elements[uVar4] = pcVar9;
      uVar5 = uVar12 & 0xffffffff;
      pcVar9 = buffer + uVar12;
      for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
        for (pcVar11 = elements[uVar8]; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
          *pcVar9 = *pcVar11;
          pcVar9 = pcVar9 + 1;
          uVar5 = (ulong)((int)uVar5 + 1);
        }
      }
      *pcVar9 = '\0';
      cVar6 = (*fn)(context,start,nameChoice,buffer,(uint)uVar5 & 0xffff);
    }
    return '\x01';
  }
  if ((range->type == '\0') && (uVar3 = getAlgName(range,start,nameChoice,buffer,200), uVar3 != 0))
  {
    UVar2 = (*fn)(context,start,nameChoice,buffer,(uint)uVar3);
    if (UVar2 == '\0') {
      return '\0';
    }
    pcVar9 = (char *)((long)elements + 0x3e);
    do {
      pcVar11 = pcVar9 + 2;
      pcVar9 = pcVar9 + 1;
    } while (*pcVar11 != '\0');
    while (start = start + 1, pcVar11 = pcVar9, start < limit) {
      for (; (cVar6 = *pcVar11, 8 < (byte)(cVar6 - 0x30U) && (4 < (byte)(cVar6 + 0xbfU)));
          pcVar11 = pcVar11 + -1) {
        if (cVar6 == 'F') {
          *pcVar11 = '0';
        }
        else if (cVar6 == '9') {
          cVar6 = 'A';
          goto LAB_002cbf92;
        }
      }
      cVar6 = cVar6 + '\x01';
LAB_002cbf92:
      *pcVar11 = cVar6;
      UVar2 = (*fn)(context,start,nameChoice,buffer,(uint)uVar3);
      if (UVar2 == '\0') {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static UBool
enumAlgNames(AlgorithmicRange *range,
             UChar32 start, UChar32 limit,
             UEnumCharNamesFn *fn, void *context,
             UCharNameChoice nameChoice) {
    char buffer[200];
    uint16_t length;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        return TRUE;
    }

    switch(range->type) {
    case 0: {
        char *s, *end;
        char c;

        /* get the full name of the start character */
        length=getAlgName(range, (uint32_t)start, nameChoice, buffer, sizeof(buffer));
        if(length<=0) {
            return TRUE;
        }

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* go to the end of the name; all these names have the same length */
        end=buffer;
        while(*end!=0) {
            ++end;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the hexadecimal number on a character-basis */
            s=end;
            for (;;) {
                c=*--s;
                if(('0'<=c && c<'9') || ('A'<=c && c<'F')) {
                    *s=(char)(c+1);
                    break;
                } else if(c=='9') {
                    *s='A';
                    break;
                } else if(c=='F') {
                    *s='0';
                }
            }

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    case 1: {
        uint16_t indexes[8];
        const char *elementBases[8], *elements[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char *suffix, *t;
        uint16_t prefixLength, i, idx;

        char c;

        /* name = prefix factorized-elements */

        /* copy prefix */
        suffix=buffer;
        prefixLength=0;
        while((c=*s++)!=0) {
            *suffix++=c;
            ++prefixLength;
        }

        /* append the suffix of the start character */
        length=(uint16_t)(prefixLength+writeFactorSuffix(factors, count,
                                              s, (uint32_t)start-range->start,
                                              indexes, elementBases, elements,
                                              suffix, (uint16_t)(sizeof(buffer)-prefixLength)));

        /* call the enumerator function with this first character */
        if(!fn(context, start, nameChoice, buffer, length)) {
            return FALSE;
        }

        /* enumerate the rest of the names */
        while(++start<limit) {
            /* increment the indexes in lexical order bound by the factors */
            i=count;
            for (;;) {
                idx=(uint16_t)(indexes[--i]+1);
                if(idx<factors[i]) {
                    /* skip one index and its element string */
                    indexes[i]=idx;
                    s=elements[i];
                    while(*s++!=0) {
                    }
                    elements[i]=s;
                    break;
                } else {
                    /* reset this index to 0 and its element string to the first one */
                    indexes[i]=0;
                    elements[i]=elementBases[i];
                }
            }

            /* to make matters a little easier, just append all elements to the suffix */
            t=suffix;
            length=prefixLength;
            for(i=0; i<count; ++i) {
                s=elements[i];
                while((c=*s++)!=0) {
                    *t++=c;
                    ++length;
                }
            }
            /* zero-terminate */
            *t=0;

            if(!fn(context, start, nameChoice, buffer, length)) {
                return FALSE;
            }
        }
        break;
    }
    default:
        /* undefined type */
        break;
    }

    return TRUE;
}